

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTransform.cpp
# Opt level: O2

void __thiscall
xmrig::BaseTransform::transformUint64(BaseTransform *this,Document *doc,int key,uint64_t arg)

{
  char *key_00;
  
  if (key == 0x52) {
    key_00 = "retry-pause";
  }
  else {
    if (key == 0x1004) {
      this->m_http = true;
      set<unsigned_long>(this,doc,"http","port",arg);
      return;
    }
    if (key == 0x3eb) {
      key_00 = "donate-level";
    }
    else if (key == 0x3ef) {
      key_00 = "print-time";
    }
    else {
      if (key == 0x3fb) {
        add<unsigned_long>(this,doc,"pools","daemon-poll-interval",arg,false);
        return;
      }
      if (key != 0x72) {
        return;
      }
      key_00 = "retries";
    }
  }
  set<unsigned_long>(this,doc,key_00,arg);
  return;
}

Assistant:

void xmrig::BaseTransform::transformUint64(rapidjson::Document &doc, int key, uint64_t arg)
{
    switch (key) {
    case IConfig::RetriesKey: /* --retries */
        return set(doc, "retries", arg);

    case IConfig::RetryPauseKey: /* --retry-pause */
        return set(doc, "retry-pause", arg);

    case IConfig::DonateLevelKey: /* --donate-level */
        return set(doc, "donate-level", arg);

    case IConfig::HttpPort: /* --http-port */
        m_http = true;
        return set(doc, kHttp, "port", arg);

    case IConfig::PrintTimeKey: /* --print-time */
        return set(doc, "print-time", arg);

#   ifdef XMRIG_FEATURE_HTTP
    case IConfig::DaemonPollKey:  /* --daemon-poll-interval */
        return add(doc, kPools, "daemon-poll-interval", arg);
#   endif

    default:
        break;
    }
}